

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Manifest.cpp
# Opt level: O0

void __thiscall llbuild::ninja::Manifest::Manifest(Manifest *this)

{
  BumpPtrAllocator *pBVar1;
  Pool *pPVar2;
  Pool **ppPVar3;
  Rule *pRVar4;
  Scope *this_00;
  rule_set *this_01;
  Rule **ppRVar5;
  StringRef local_90;
  StringRef local_80;
  StringRef local_70;
  StringRef local_60;
  Manifest *local_50;
  Manifest *this_local;
  StringRef *local_40;
  char *local_38;
  StringRef *local_30;
  char *local_28;
  StringRef *local_20;
  char *local_18;
  StringRef *local_10;
  
  local_50 = this;
  llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::BumpPtrAllocatorImpl
            (&this->allocator);
  Scope::Scope(&this->rootScope,(Scope *)0x0);
  llvm::StringMap<llbuild::ninja::Node_*,_llvm::MallocAllocator>::StringMap(&this->nodes);
  std::vector<llbuild::ninja::Command_*,_std::allocator<llbuild::ninja::Command_*>_>::vector
            (&this->commands);
  llvm::StringMap<llbuild::ninja::Pool_*,_llvm::MallocAllocator>::StringMap(&this->pools);
  std::vector<llbuild::ninja::Node_*,_std::allocator<llbuild::ninja::Node_*>_>::vector
            (&this->defaultTargets);
  pBVar1 = getAllocator(this);
  pPVar2 = (Pool *)new<llvm::MallocAllocator,4096ul,4096ul>(0x28,pBVar1);
  local_40 = &local_60;
  this_local = (Manifest *)anon_var_dwarf_ad3e5;
  strlen("console");
  Pool::Pool(pPVar2,local_60);
  this->consolePool = pPVar2;
  if (this->consolePool == (Pool *)0x0) {
    __assert_fail("consolePool != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/Ninja/Manifest.cpp"
                  ,0x26,"llbuild::ninja::Manifest::Manifest()");
  }
  if (this->consolePool != (Pool *)0x0) {
    Pool::setDepth(this->consolePool,1);
  }
  pPVar2 = this->consolePool;
  local_30 = &local_70;
  local_38 = "console";
  strlen("console");
  ppPVar3 = llvm::StringMap<llbuild::ninja::Pool_*,_llvm::MallocAllocator>::operator[]
                      (&this->pools,local_70);
  *ppPVar3 = pPVar2;
  pBVar1 = getAllocator(this);
  pRVar4 = (Rule *)new<llvm::MallocAllocator,4096ul,4096ul>(0x40,pBVar1);
  local_20 = &local_80;
  local_28 = "phony";
  strlen("phony");
  Rule::Rule(pRVar4,local_80);
  this->phonyRule = pRVar4;
  pRVar4 = this->phonyRule;
  this_00 = getRootScope(this);
  this_01 = Scope::getRules(this_00);
  local_10 = &local_90;
  local_18 = "phony";
  strlen("phony");
  ppRVar5 = llvm::StringMap<llbuild::ninja::Rule_*,_llvm::MallocAllocator>::operator[]
                      (this_01,local_90);
  *ppRVar5 = pRVar4;
  return;
}

Assistant:

Manifest::Manifest() {
  // Create the built-in console pool, and add it to the pool map.
  consolePool = new (getAllocator()) Pool("console");
  assert(consolePool != nullptr);
  if (consolePool)
    consolePool->setDepth(1);
  pools["console"] = consolePool;

  // Create the built-in phony rule, and add it to the rule map.
  phonyRule = new (getAllocator()) Rule("phony");
  getRootScope().getRules()["phony"] = phonyRule;
}